

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountTest.cpp
# Opt level: O0

void __thiscall
oout::CountTest::CountTest
          (CountTest *this,
          list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
          *results)

{
  undefined1 local_30 [8];
  shared_ptr<const_oout::Result> local_28;
  list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
  *local_18;
  list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
  *results_local;
  CountTest *this_local;
  
  local_18 = results;
  results_local =
       (list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
        *)this;
  std::
  make_unique<oout::SuiteResult,std::__cxx11::list<std::shared_ptr<oout::Result_const>,std::allocator<std::shared_ptr<oout::Result_const>>>const&>
            ((list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
              *)local_30);
  std::shared_ptr<oout::Result_const>::
  shared_ptr<oout::SuiteResult,std::default_delete<oout::SuiteResult>,void>
            ((shared_ptr<oout::Result_const> *)&local_28,
             (unique_ptr<oout::SuiteResult,_std::default_delete<oout::SuiteResult>_> *)local_30);
  CountTest(this,&local_28);
  std::shared_ptr<const_oout::Result>::~shared_ptr(&local_28);
  std::unique_ptr<oout::SuiteResult,_std::default_delete<oout::SuiteResult>_>::~unique_ptr
            ((unique_ptr<oout::SuiteResult,_std::default_delete<oout::SuiteResult>_> *)local_30);
  return;
}

Assistant:

CountTest::CountTest(const list<shared_ptr<const Result>> &results)
	: CountTest(make_unique<SuiteResult>(results))
{
}